

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::h_CBRANCH(Instruction *this,ostream *os)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  ostream *poVar4;
  void *this_00;
  ostream *in_RSI;
  Instruction *in_RDI;
  int srcIndex;
  int dstIndex;
  
  bVar1 = in_RDI->dst;
  poVar4 = std::operator<<(in_RSI,"r");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)bVar1 % 8);
  poVar4 = std::operator<<(poVar4,", ");
  uVar2 = getImm32((Instruction *)0x111278);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,", COND ");
  iVar3 = getModCond(in_RDI);
  this_00 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Instruction::h_CBRANCH(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", " << (int32_t)getImm32() << ", COND " << (int)(getModCond()) << std::endl;
	}